

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

CURLcode cf_socket_open(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_sockaddr_ex *addr;
  uint *sockfd;
  undefined1 *puVar1;
  uchar uVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  connectdata *pcVar6;
  _Bool _Var7;
  uchar uVar8;
  sa_family_t sVar9;
  if2ip_result_t iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  if2ip_result_t iVar14;
  uint *puVar15;
  int *piVar16;
  size_t sVar17;
  char *pcVar18;
  ulong uVar19;
  socklen_t sVar20;
  long lVar21;
  uint uVar22;
  char *pcVar23;
  ushort uVar24;
  ushort uVar25;
  bool bVar26;
  char cVar27;
  bool bVar28;
  curltime cVar29;
  Curl_dns_entry *h;
  int on;
  curl_socklen_t size;
  curl_socklen_t onoff;
  char buffer [256];
  Curl_sockaddr_storage add;
  socklen_t local_288;
  Curl_dns_entry *local_258;
  uint local_24c;
  char *local_248;
  undefined4 local_240;
  socklen_t local_23c;
  sockaddr local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  char local_1b8 [256];
  sockaddr local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pvVar4 = cf->ctx;
  cVar29 = Curl_now();
  *(time_t *)((long)pvVar4 + 0x148) = cVar29.tv_sec;
  *(int *)((long)pvVar4 + 0x150) = cVar29.tv_usec;
  addr = (Curl_sockaddr_ex *)((long)pvVar4 + 8);
  sockfd = (uint *)((long)pvVar4 + 0x98);
  iVar10 = socket_open(data,addr,(curl_socket_t *)sockfd);
  if (iVar10 != IF2IP_NOT_FOUND) {
    bVar26 = false;
    goto LAB_006c62cb;
  }
  pvVar5 = cf->ctx;
  _Var7 = Curl_addr2string((sockaddr *)((long)pvVar5 + 0x18),
                           *(curl_socklen_t *)((long)pvVar5 + 0x14),(char *)((long)pvVar5 + 0xe0),
                           (int *)((long)pvVar5 + 0x110));
  if (!_Var7) {
    puVar15 = (uint *)__errno_location();
    *(uint *)((long)pvVar5 + 0x178) = *puVar15;
    uVar3 = *puVar15;
    Curl_strerror(uVar3,local_1b8,0x100);
    Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar3);
    bVar26 = false;
    iVar10 = IF2IP_FOUND;
    goto LAB_006c62cb;
  }
  if (addr->family == 10) {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      pcVar23 = "  Trying [%s]:%d...";
LAB_006c5a58:
      Curl_infof(data,pcVar23,(long)pvVar4 + 0xe0);
    }
  }
  else if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
    pcVar23 = "  Trying %s:%d...";
    goto LAB_006c5a58;
  }
  if ((addr->family | 8U) == 10) {
    bVar26 = *(int *)((long)pvVar4 + 0xc) == 1;
  }
  else {
    bVar26 = false;
  }
  if (bVar26) {
    if (((data->set).field_0x8be & 2) != 0) {
      local_238._0_4_ = 1;
      iVar11 = setsockopt(*sockfd,6,1,&local_238,4);
      if (((data != (Curl_easy *)0x0) && (iVar11 < 0)) && (((data->set).field_0x8bd & 0x10) != 0)) {
        piVar16 = __errno_location();
        pcVar23 = Curl_strerror(*piVar16,local_1b8,0x100);
        Curl_infof(data,"Could not set TCP_NODELAY: %s",pcVar23);
      }
    }
    if ((bVar26) && (((data->set).field_0x8be & 0x80) != 0)) {
      tcpkeepalive(data,*sockfd);
    }
  }
  if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_006c5af9:
    bVar26 = false;
  }
  else {
    Curl_set_in_callback(data,true);
    iVar11 = (*(data->set).fsockopt)((data->set).sockopt_client,*sockfd,CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data,false);
    if (iVar11 != 2) {
      if (iVar11 != 0) {
        bVar26 = false;
        iVar10 = 0x2a;
        goto LAB_006c62cb;
      }
      goto LAB_006c5af9;
    }
    bVar26 = true;
  }
  uVar3 = addr->family;
  if ((uVar3 | 8) == 10) {
    pcVar6 = cf->conn;
    iVar11 = *(int *)((long)pvVar4 + 0x98);
    uVar12 = Curl_ipv6_scope((sockaddr *)((long)pvVar4 + 0x18));
    local_258 = (Curl_dns_entry *)0x0;
    uVar24 = (data->set).localport;
    uVar22 = (uint)(data->set).localportrange;
    pcVar23 = (data->set).str[8];
    local_240 = 1;
    iVar14 = IF2IP_NOT_FOUND;
    if (uVar24 != 0 || pcVar23 != (char *)0x0) {
      local_248 = (char *)CONCAT44(local_248._4_4_,uVar12);
      local_1c8 = 0;
      uStack_1c0 = 0;
      local_1d8 = 0;
      uStack_1d0 = 0;
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_1f8 = 0;
      uStack_1f0 = 0;
      local_208 = 0;
      uStack_200 = 0;
      local_218 = 0;
      uStack_210 = 0;
      local_228 = 0;
      uStack_220 = 0;
      local_238.sa_family = 0;
      local_238.sa_data[0] = '\0';
      local_238.sa_data[1] = '\0';
      local_238.sa_data[2] = '\0';
      local_238.sa_data[3] = '\0';
      local_238.sa_data[4] = '\0';
      local_238.sa_data[5] = '\0';
      local_238.sa_data[6] = '\0';
      local_238.sa_data[7] = '\0';
      local_238.sa_data[8] = '\0';
      local_238.sa_data[9] = '\0';
      local_238.sa_data[10] = '\0';
      local_238.sa_data[0xb] = '\0';
      local_238.sa_data[0xc] = '\0';
      local_238.sa_data[0xd] = '\0';
      if ((pcVar23 == (char *)0x0) || (sVar17 = strlen(pcVar23), 0xfe < sVar17)) {
        if (uVar3 == 10) {
          local_288 = 0x1c;
          sVar9 = 10;
        }
        else {
          local_288 = 0;
          if (uVar3 != 2) goto LAB_006c60f5;
          local_288 = 0x10;
          sVar9 = 2;
        }
        local_238.sa_data._0_2_ = uVar24 << 8 | uVar24 >> 8;
        local_238.sa_family = sVar9;
      }
      else {
        local_288 = 0;
        memset(local_1b8,0,0x100);
        iVar13 = strncmp("if!",pcVar23,3);
        cVar27 = iVar13 == 0;
        if ((bool)cVar27) {
          bVar28 = false;
          lVar21 = 3;
        }
        else {
          iVar13 = strncmp("host!",pcVar23,5);
          bVar28 = iVar13 == 0;
          lVar21 = (ulong)bVar28 * 5;
        }
        pcVar23 = pcVar23 + lVar21;
        if (bVar28) goto LAB_006c5d0d;
        local_24c = (uint)(byte)cVar27;
        sVar17 = strlen(pcVar23);
        iVar13 = setsockopt(iVar11,1,0x19,pcVar23,(int)sVar17 + 1);
        if (iVar13 == 0) {
          if (data == (Curl_easy *)0x0) {
LAB_006c5e2d:
            bVar28 = false;
            local_288 = 0;
            iVar14 = IF2IP_NOT_FOUND;
          }
          else {
            bVar28 = false;
            local_288 = 0;
            iVar14 = IF2IP_NOT_FOUND;
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"socket successfully bound to interface \'%s\'",pcVar23);
              goto LAB_006c5e2d;
            }
          }
        }
        else {
          iVar14 = Curl_if2ip(uVar3,(uint)local_248,pcVar6->scope_id,pcVar23,local_1b8,0x100);
          if (iVar14 == IF2IP_FOUND) {
            cVar27 = '\x01';
            local_288 = 1;
            if (data != (Curl_easy *)0x0) {
              if (((data->set).field_0x8bd & 0x10) == 0) goto LAB_006c5d0d;
              Curl_infof(data,"Local Interface %s is ip %s using address family %i",pcVar23,
                         local_1b8,(ulong)uVar3);
            }
            cVar27 = '\x01';
LAB_006c5d0d:
            sVar20 = local_288;
            if (cVar27 == '\0') {
              uVar2 = pcVar6->ip_version;
              if (uVar3 == 2) {
                uVar8 = '\x01';
LAB_006c5e3f:
                pcVar6->ip_version = uVar8;
              }
              else if (uVar3 == 10) {
                uVar8 = '\x02';
                goto LAB_006c5e3f;
              }
              Curl_resolv(data,pcVar23,0x50,false,&local_258);
              pcVar6->ip_version = uVar2;
              if (local_258 == (Curl_dns_entry *)0x0) {
                bVar28 = true;
                local_288 = -1;
              }
              else {
                Curl_printable_address(local_258->addr,local_1b8,0x100);
                if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                  Curl_infof(data,"Name \'%s\' family %i resolved to \'%s\' family %i",pcVar23,
                             (ulong)uVar3,local_1b8,(ulong)(uint)local_258->addr->ai_family);
                }
                Curl_resolv_unlock(data,local_258);
                bVar28 = local_258->addr->ai_family == uVar3;
                if (bVar28) {
                  local_288 = 1;
                }
              }
              sVar20 = local_288;
              if (!bVar28) {
                iVar14 = IF2IP_AF_NOT_SUPPORTED;
                goto LAB_006c5f77;
              }
            }
            local_288 = 0;
            if (0 < (int)sVar20) {
              if (uVar3 == 2) {
                iVar13 = inet_pton(2,local_1b8,local_238.sa_data + 2);
                if (0 < iVar13) {
                  local_238.sa_data._0_2_ = uVar24 << 8 | uVar24 >> 8;
                  local_238.sa_family = 2;
                  local_288 = 0x10;
                }
              }
              else if (uVar3 == 10) {
                pcVar18 = strchr(local_1b8,0x25);
                if (pcVar18 == (char *)0x0) {
                  local_248 = (char *)0x0;
                }
                else {
                  local_248 = pcVar18 + 1;
                  *pcVar18 = '\0';
                }
                iVar13 = inet_pton(10,local_1b8,local_238.sa_data + 6);
                local_288 = 0x1c;
                bVar28 = true;
                if (0 < iVar13) {
                  local_238.sa_data._0_2_ = uVar24 << 8 | uVar24 >> 8;
                  local_238.sa_family = 10;
                  if (local_248 != (char *)0x0) {
                    bVar28 = false;
                    uVar19 = strtoul(local_248,(char **)0x0,10);
                    local_288 = 0;
                    if (uVar19 >> 0x20 == 0) {
                      uStack_220 = CONCAT44(uStack_220._4_4_,(int)uVar19);
                      bVar28 = true;
                      local_288 = 0x1c;
                    }
                  }
                }
                if (!bVar28) {
                  iVar14 = IF2IP_AF_NOT_SUPPORTED;
                  bVar28 = false;
                  goto LAB_006c60ed;
                }
              }
            }
            if ((int)sVar20 < 1) {
              puVar1 = &(data->state).field_0x74c;
              *puVar1 = *puVar1 & 0xf7;
              Curl_failf(data,"Couldn\'t bind to \'%s\'",pcVar23);
              bVar28 = false;
              iVar14 = 0x2d;
            }
            else {
              iVar14 = IF2IP_AF_NOT_SUPPORTED;
              bVar28 = true;
            }
          }
          else {
            local_288 = 0;
            if (iVar14 != IF2IP_AF_NOT_SUPPORTED) {
              cVar27 = (char)local_24c;
              if ((iVar14 == IF2IP_NOT_FOUND) && (cVar27 != '\0')) {
                Curl_failf(data,"Couldn\'t bind to interface \'%s\'");
                bVar28 = false;
                iVar14 = 0x2d;
                local_288 = 0;
                goto LAB_006c60ed;
              }
              goto LAB_006c5d0d;
            }
LAB_006c5f77:
            local_288 = 0;
            bVar28 = false;
          }
        }
LAB_006c60ed:
        if (!bVar28) goto LAB_006c6285;
      }
LAB_006c60f5:
      setsockopt(iVar11,0,0x18,&local_240,4);
      iVar13 = bind(iVar11,&local_238,local_288);
      uVar25 = uVar24;
      while (iVar13 < 0) {
        uVar25 = uVar25 + 1;
        if (((int)uVar22 < 2) || (uVar25 == 0)) {
          puVar15 = (uint *)__errno_location();
          uVar3 = *puVar15;
          (data->state).os_errno = uVar3;
          pcVar23 = Curl_strerror(uVar3,local_1b8,0x100);
          pcVar18 = "bind failed with errno %d: %s";
          goto LAB_006c626c;
        }
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"Bind to local port %d failed, trying next",(ulong)(uVar25 - 1));
        }
        local_238.sa_data._0_2_ = uVar25 * 0x100 | uVar25 >> 8;
        iVar13 = bind(iVar11,&local_238,local_288);
        uVar24 = uVar24 + 1;
        uVar22 = uVar22 - 1;
      }
      local_23c = 0x80;
      local_b8.sa_family = 0;
      local_b8.sa_data[0] = '\0';
      local_b8.sa_data[1] = '\0';
      local_b8.sa_data[2] = '\0';
      local_b8.sa_data[3] = '\0';
      local_b8.sa_data[4] = '\0';
      local_b8.sa_data[5] = '\0';
      local_b8.sa_data[6] = '\0';
      local_b8.sa_data[7] = '\0';
      local_b8.sa_data[8] = '\0';
      local_b8.sa_data[9] = '\0';
      local_b8.sa_data[10] = '\0';
      local_b8.sa_data[0xb] = '\0';
      local_b8.sa_data[0xc] = '\0';
      local_b8.sa_data[0xd] = '\0';
      local_a8 = 0;
      uStack_a0 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      iVar11 = getsockname(iVar11,&local_b8,&local_23c);
      if (iVar11 < 0) {
        puVar15 = (uint *)__errno_location();
        uVar3 = *puVar15;
        (data->state).os_errno = uVar3;
        pcVar23 = Curl_strerror(uVar3,local_1b8,0x100);
        pcVar18 = "getsockname() failed with errno %d: %s";
LAB_006c626c:
        Curl_failf(data,pcVar18,(ulong)uVar3,pcVar23);
        iVar14 = 0x2d;
      }
      else {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"Local port: %hu",(ulong)uVar24);
        }
        puVar1 = &(pcVar6->bits).field_0x2;
        *puVar1 = *puVar1 | 0x40;
        iVar14 = IF2IP_NOT_FOUND;
      }
    }
LAB_006c6285:
    if (iVar14 != IF2IP_NOT_FOUND) {
      iVar10 = 7;
      if (iVar14 != IF2IP_AF_NOT_SUPPORTED) {
        iVar10 = iVar14;
      }
      goto LAB_006c62cb;
    }
  }
  curlx_nonblock(*(curl_socket_t *)((long)pvVar4 + 0x98),1);
  *(byte *)((long)pvVar4 + 0x17c) =
       *(byte *)((long)pvVar4 + 0x17c) & 0xfb | (*(int *)((long)pvVar4 + 0xc) != 2) << 2;
  iVar10 = IF2IP_NOT_FOUND;
LAB_006c62cb:
  if (iVar10 == IF2IP_NOT_FOUND) {
    if (bVar26) {
      set_local_ip(cf,data);
      cVar29 = Curl_now();
      *(time_t *)((long)pvVar4 + 0x158) = cVar29.tv_sec;
      *(int *)((long)pvVar4 + 0x160) = cVar29.tv_usec;
      cf->field_0x24 = cf->field_0x24 | 1;
    }
  }
  else if (*sockfd != 0xffffffff) {
    socket_close(data,cf->conn,1,*sockfd);
    *sockfd = 0xffffffff;
  }
  if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
      ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"cf_socket_open() -> %d, fd=%d",(ulong)iVar10,(ulong)*sockfd);
  }
  return iVar10;
}

Assistant:

static CURLcode cf_socket_open(struct Curl_cfilter *cf,
                              struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  int error = 0;
  bool isconnected = FALSE;
  CURLcode result = CURLE_COULDNT_CONNECT;
  bool is_tcp;

  (void)data;
  DEBUGASSERT(ctx->sock == CURL_SOCKET_BAD);
  ctx->started_at = Curl_now();
  result = socket_open(data, &ctx->addr, &ctx->sock);
  if(result)
    goto out;

  result = set_remote_ip(cf, data);
  if(result)
    goto out;

#ifdef ENABLE_IPV6
  if(ctx->addr.family == AF_INET6) {
    set_ipv6_v6only(ctx->sock, 0);
    infof(data, "  Trying [%s]:%d...", ctx->r_ip, ctx->r_port);
  }
  else
#endif
    infof(data, "  Trying %s:%d...", ctx->r_ip, ctx->r_port);

#ifdef ENABLE_IPV6
  is_tcp = (ctx->addr.family == AF_INET
            || ctx->addr.family == AF_INET6) &&
           ctx->addr.socktype == SOCK_STREAM;
#else
  is_tcp = (ctx->addr.family == AF_INET) &&
           ctx->addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, ctx->sock);

  nosigpipe(data, ctx->sock);

  Curl_sndbufset(ctx->sock);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, ctx->sock);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               ctx->sock,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

#ifndef CURL_DISABLE_BINDLOCAL
  /* possibly bind the local end to an IP, interface or port */
  if(ctx->addr.family == AF_INET
#ifdef ENABLE_IPV6
     || ctx->addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, cf->conn, ctx->sock, ctx->addr.family,
                       Curl_ipv6_scope(&ctx->addr.sa_addr));
    if(result) {
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        result = CURLE_COULDNT_CONNECT;
      }
      goto out;
    }
  }
#endif

  /* set socket non-blocking */
  (void)curlx_nonblock(ctx->sock, TRUE);
  ctx->sock_connected = (ctx->addr.socktype != SOCK_DGRAM);
out:
  if(result) {
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
  }
  else if(isconnected) {
    set_local_ip(cf, data);
    ctx->connected_at = Curl_now();
    cf->connected = TRUE;
  }
  CURL_TRC_CF(data, cf, "cf_socket_open() -> %d, fd=%" CURL_FORMAT_SOCKET_T,
              result, ctx->sock);
  return result;
}